

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

void free_multiple_field(uint len,void *arg,char ***orig)

{
  undefined8 *in_RDX;
  void *in_RSI;
  uint in_EDI;
  uint i;
  undefined4 local_1c;
  
  if (in_RSI != (void *)0x0) {
    for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
      free_string_field((char **)0x142924);
    }
    free(in_RSI);
    free((void *)*in_RDX);
    *in_RDX = 0;
  }
  return;
}

Assistant:

static void
free_multiple_field(unsigned int len, void *arg, char ***orig)
{
  unsigned int i;
  if (arg) {
    for (i = 0; i < len; ++i)
      {
        free_string_field(&((*orig)[i]));
      }

    free (arg);
    free (*orig);
    *orig = 0;
  }
}